

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,string_view configureString)

{
  string_view message;
  string_view message_00;
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  char *__str;
  element_type *peVar3;
  undefined8 uVar4;
  char *in_RCX;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  __shared_ptr *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  __sv_type _Var5;
  shared_ptr<helics::Broker> sVar6;
  CoreType newType;
  string newName;
  shared_ptr<helics::Broker> *broker;
  string *in_stack_000006b8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  __shared_ptr *p_Var7;
  allocator<char> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  CoreType in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  size_t local_d8;
  char *local_d0;
  allocator<char> local_a1 [13];
  CoreType in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  p_Var7 = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffec0);
  if ((in_ESI == 0x65) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), bVar1)) {
    in_stack_fffffffffffffec0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0);
    helics::core::extractCoreType(in_stack_000006b8);
    std::tie<helics::CoreType,std::__cxx11::string>
              (&in_stack_fffffffffffffeb8->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x437f34);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::allocator<char>::~allocator(local_a1);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x437f71), !bVar1)) {
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      local_d8 = _Var5._M_len;
      local_18._M_len = local_d8;
      local_d0 = _Var5._M_str;
      local_18._M_str = local_d0;
    }
  }
  name._M_len._4_4_ = in_stack_fffffffffffffef4;
  name._M_len._0_4_ = in_stack_fffffffffffffef0;
  name._M_str = in_stack_fffffffffffffef8;
  makeBroker(in_stack_fffffffffffffeec,name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4380f3);
    (*peVar3->_vptr_Broker[8])(peVar3,in_R8,in_R9);
    uVar2 = registerBroker((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c);
    if ((bool)uVar2) {
      peVar3 = CLI::std::
               __shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x43818e);
      (*peVar3->_vptr_Broker[2])();
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffeb0));
      sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var7;
      return (shared_ptr<helics::Broker>)
             sVar6.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
    }
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,
               (char *)in_stack_fffffffffffffeb8);
    message_00._M_str = (char *)p_Var7;
    message_00._M_len = (size_t)in_RDI;
    RegistrationFailure::RegistrationFailure
              ((RegistrationFailure *)in_stack_fffffffffffffec0,message_00);
    __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
  }
  __str = (char *)__cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec0,__str);
  message._M_str = (char *)p_Var7;
  message._M_len = (size_t)in_RDI;
  RegistrationFailure::RegistrationFailure((RegistrationFailure *)in_stack_fffffffffffffec0,message)
  ;
  __cxa_throw(__str,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

std::shared_ptr<Broker>
    create(CoreType type, std::string_view brokerName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    if (!broker) {
        throw(helics::RegistrationFailure("unable to create broker"));
    }
    broker->configure(configureString);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}